

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicswidget_p.cpp
# Opt level: O3

void __thiscall QGraphicsWidgetPrivate::setHeight(QGraphicsWidgetPrivate *this,qreal h)

{
  long lVar1;
  QGraphicsItem *pQVar2;
  char cVar3;
  QGraphicsItem *pQVar4;
  long in_FS_OFFSET;
  QPointF QVar5;
  double local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = qIsNaN(h);
  if (cVar3 == '\0') {
    pQVar2 = (this->super_QGraphicsItemPrivate).q_ptr;
    pQVar4 = pQVar2 + -1;
    if (pQVar2 == (QGraphicsItem *)0x0) {
      pQVar4 = (QGraphicsItem *)0x0;
    }
    QGraphicsLayoutItem::geometry((QGraphicsLayoutItem *)(pQVar4 + 2));
    if ((local_28 != h) || (NAN(local_28) || NAN(h))) {
      QGraphicsItem::pos(pQVar4 + 1);
      QVar5 = QGraphicsItem::pos(pQVar4 + 1);
      (*(this->super_QGraphicsItemPrivate)._vptr_QGraphicsItemPrivate[0xb])(QVar5.xp,this);
      (*pQVar4->_vptr_QGraphicsItem[0xc])(pQVar4);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsWidgetPrivate::setHeight(qreal h)
{
    if (qIsNaN(h))
        return;
    Q_Q(QGraphicsWidget);
    if (q->geometry().height() == h)
        return;

    q->setGeometry(QRectF(q->x(), q->y(), width(), h));
}